

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_CELL ref_cell;
  uint uVar3;
  REF_BOOL has_qua;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_INT nodes [27];
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  REF_CELL local_b8;
  REF_INT local_b0;
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->cell[3];
  *allowed = 0;
  uVar3 = ref_cell_has_side(ref_grid->cell[0],node0,node1,&local_c0);
  if (uVar3 == 0) {
    local_b8 = pRVar2;
    uVar3 = ref_cell_has_side(ref_grid->cell[3],node0,node1,&local_c4);
    if (uVar3 == 0) {
      uVar3 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&local_c8);
      pRVar2 = local_b8;
      if (uVar3 == 0) {
        if ((local_c0 == 0) && ((local_c4 == 0 || (local_c8 == 0)))) {
          uVar3 = ref_cell_list_with2(local_b8,node0,node1,2,&local_bc,&local_b0);
          ref_cell = local_b8;
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x163,"ref_swap_same_faceid",(ulong)uVar3,"more then two");
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            ref_swap_tattle_nodes(pRVar2,node0,node1);
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
            return uVar3;
          }
          if ((long)local_bc != 0) {
            if (local_bc != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x16d,"ref_swap_same_faceid",
                     "there should be zero or two triangles for manifold",2,(long)local_bc);
              ref_node_location(ref_grid->node,node0);
              ref_node_location(ref_grid->node,node1);
              ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
              return 1;
            }
            uVar3 = ref_cell_nodes(local_b8,local_b0,local_a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x16f,"ref_swap_same_faceid",(ulong)uVar3,"nodes tri0");
              return uVar3;
            }
            iVar1 = local_a8[ref_cell->node_per];
            uVar3 = ref_cell_nodes(ref_cell,local_ac,local_a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x171,"ref_swap_same_faceid",(ulong)uVar3,"nodes tri1");
              return uVar3;
            }
            if (iVar1 != local_a8[ref_cell->node_per]) {
              return 0;
            }
            *allowed = 1;
            return 0;
          }
          *allowed = 1;
        }
        else {
          *allowed = 0;
        }
        uVar3 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x158,"ref_swap_same_faceid",(ulong)uVar3,"qua side");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x156,
             "ref_swap_same_faceid",(ulong)uVar3,"tri side");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x154,
           "ref_swap_same_faceid",(ulong)uVar3,"edg side");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id0, id1;
  REF_BOOL has_edg, has_tri, has_qua;

  *allowed = REF_FALSE;

  RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
      "edg side");
  RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
      "tri side");
  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &has_qua),
      "qua side");
  if (has_edg || (has_tri && has_qua)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }
  RSB(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two", {
        ref_node_location(ref_grid_node(ref_grid), node0);
        ref_node_location(ref_grid_node(ref_grid), node1);
        ref_swap_tattle_nodes(ref_cell, node0, node1);
        ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
      });

  if (0 == ncell) { /* away from boundary */
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }
  REIB(2, ncell, "there should be zero or two triangles for manifold", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
  });

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  id0 = nodes[ref_cell_node_per(ref_cell)];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  id1 = nodes[ref_cell_node_per(ref_cell)];

  if (id0 == id1) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}